

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O1

int platform_make_x11_server
              (Plug *plug,char *progname,int mindisp,char *screen_number_suffix,ptrlen authproto,
              ptrlen authdata,Socket **sockets,Conf *conf)

{
  bool bVar1;
  ptrlen authproto_00;
  ptrlen authproto_01;
  char cVar2;
  int iVar3;
  __mode_t __mask;
  int iVar4;
  __pid_t _Var5;
  strbuf *buf_o;
  Socket *pSVar6;
  char *pcVar7;
  char *pcVar8;
  SockAddr *listenaddr;
  FILE *__s;
  char *value;
  ssize_t sVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int cleanup_pipe [2];
  char *canonicalname;
  SockAddr *local_1070;
  int local_1060;
  int local_105c;
  char *local_1058;
  void *local_1050;
  size_t local_1048;
  char *local_1040;
  char *local_1038 [513];
  
  local_1048 = authproto.len;
  local_1050 = authproto.ptr;
  uVar10 = 0;
  local_1040 = screen_number_suffix;
  buf_o = strbuf_new_nm();
  local_1070 = (SockAddr *)0x0;
  while( true ) {
    pSVar6 = new_listener((char *)0x0,mindisp + 6000,plug,false,conf,1);
    sockets[(int)uVar10] = pSVar6;
    pcVar7 = (*pSVar6->vt->socket_error)(pSVar6);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = get_hostname();
      if (pcVar7 != (char *)0x0) {
        local_1038[0] = (char *)0x0;
        local_1070 = sk_namelookup(pcVar7,local_1038,1);
        safefree(local_1038[0]);
      }
      safefree(pcVar7);
      uVar10 = uVar10 + 1;
      cVar2 = '\x02';
    }
    else {
      (*sockets[(int)uVar10]->vt->close)(sockets[(int)uVar10]);
      pcVar8 = strerror(0x62);
      iVar3 = strcmp(pcVar7,pcVar8);
      cVar2 = (iVar3 != 0) * '\x05';
    }
    if (cVar2 != '\0') break;
    mindisp = mindisp + 1;
  }
  if (cVar2 == '\x02') {
    if (local_1070 != (SockAddr *)0x0) {
      authproto_00.len = local_1048;
      authproto_00.ptr = local_1050;
      x11_format_auth_for_authfile(buf_o->binarysink_,local_1070,mindisp,authproto_00,authdata);
    }
    local_1058 = dupprintf("/tmp/.X11-unix/X%d",(ulong)(uint)mindisp);
    listenaddr = unix_sock_addr(local_1058);
    pSVar6 = new_unix_listener(listenaddr,plug);
    sockets[(int)uVar10] = pSVar6;
    pcVar7 = (*pSVar6->vt->socket_error)(pSVar6);
    if (pcVar7 == (char *)0x0) {
      authproto_01.len = local_1048;
      authproto_01.ptr = local_1050;
      x11_format_auth_for_authfile(buf_o->binarysink_,listenaddr,mindisp,authproto_01,authdata);
      uVar10 = uVar10 + 1;
      pcVar7 = local_1058;
    }
    else {
      (*sockets[(int)uVar10]->vt->close)(sockets[(int)uVar10]);
      safefree(local_1058);
      pcVar7 = (char *)0x0;
    }
    pcVar8 = getenv("TMPDIR");
    if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
      pcVar8 = "/tmp";
    }
    pcVar8 = dupcat_fn(pcVar8,"/",progname,"-Xauthority-XXXXXX",0);
    __mask = umask(0x3f);
    iVar3 = mkstemp(pcVar8);
    umask(__mask);
    if (iVar3 < 0) {
      if ((int)uVar10 < 1) {
        uVar10 = uVar10 - 1;
      }
      else {
        uVar11 = (ulong)uVar10;
        do {
          (*sockets[uVar11 - 1]->vt->close)(sockets[uVar11 - 1]);
          uVar12 = uVar11 - 1;
          bVar1 = 0 < (long)uVar11;
          uVar11 = uVar12;
        } while (uVar12 != 0 && bVar1);
        uVar10 = 0xffffffff;
      }
    }
    else {
      iVar4 = pipe(&local_1060);
      if (iVar4 == 0) {
        _Var5 = fork();
        if (_Var5 == 0) {
          close(0);
          close(1);
          close(2);
          setpgid(0,0);
          close(local_105c);
          close(iVar3);
          do {
            sVar9 = read(local_1060,local_1038,0x1000);
          } while (0 < sVar9);
          unlink(pcVar8);
          if (pcVar7 != (char *)0x0) {
            unlink(pcVar7);
          }
          _exit(0);
        }
        close(local_1060);
        if (_Var5 < 0) {
          close(local_105c);
        }
        else {
          cloexec(local_105c);
        }
      }
      __s = fdopen(iVar3,"wb");
      fwrite(buf_o->u,1,buf_o->len,__s);
      fclose(__s);
      value = dupprintf(":%d%s",(ulong)(uint)mindisp,local_1040);
      conf_set_str_str(conf,0x38,"DISPLAY",value);
      safefree(value);
      conf_set_str_str(conf,0x38,"XAUTHORITY",pcVar8);
    }
  }
  else {
    if (cVar2 != '\x05') {
      return uVar10;
    }
    pcVar7 = (char *)0x0;
    pcVar8 = (char *)0x0;
  }
  if (local_1070 != (SockAddr *)0x0) {
    sk_addr_free(local_1070);
  }
  safefree(pcVar8);
  strbuf_free(buf_o);
  safefree(pcVar7);
  return uVar10;
}

Assistant:

int platform_make_x11_server(Plug *plug, const char *progname, int mindisp,
                             const char *screen_number_suffix,
                             ptrlen authproto, ptrlen authdata,
                             Socket **sockets, Conf *conf)
{
    char *tmpdir;
    char *authfilename = NULL;
    strbuf *authfiledata = NULL;
    char *unix_path = NULL;

    SockAddr *a_tcp = NULL, *a_unix = NULL;

    int authfd;
    FILE *authfp;

    int displayno;

    authfiledata = strbuf_new_nm();

    int nsockets = 0;

    /*
     * Look for a free TCP port to run our server on.
     */
    for (displayno = mindisp;; displayno++) {
        const char *err;
        int tcp_port = displayno + 6000;
        int addrtype = ADDRTYPE_IPV4;

        sockets[nsockets] = new_listener(
            NULL, tcp_port, plug, false, conf, addrtype);

        err = sk_socket_error(sockets[nsockets]);
        if (!err) {
            char *hostname = get_hostname();
            if (hostname) {
                char *canonicalname = NULL;
                a_tcp = sk_namelookup(hostname, &canonicalname, addrtype);
                sfree(canonicalname);
            }
            sfree(hostname);
            nsockets++;
            break;                     /* success! */
        } else {
            sk_close(sockets[nsockets]);
        }

        /*
         * If we weren't able to bind to this port because it's in use
         * by another program, go round this loop and try again. But
         * for any other reason, give up completely and return failure
         * to our caller.
         *
         * sk_socket_error currently has no machine-readable component
         * (it would need a cross-platform abstraction of the socket
         * error types we care about, plus translation from each OS
         * error enumeration into that). So we use the disgusting
         * approach of a string compare between the error string and
         * the one EADDRINUSE would have given :-(
         */
        if (strcmp(err, strerror(EADDRINUSE)))
            goto out;
    }

    if (a_tcp) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_tcp, displayno, authproto, authdata);
    }

    /*
     * Try to establish the Unix-domain analogue. That may or may not
     * work - file permissions in /tmp may prevent it, for example -
     * but it's worth a try, and we don't consider it a fatal error if
     * it doesn't work.
     */
    unix_path = dupprintf("/tmp/.X11-unix/X%d", displayno);
    a_unix = unix_sock_addr(unix_path);

    sockets[nsockets] = new_unix_listener(a_unix, plug);
    if (!sk_socket_error(sockets[nsockets])) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_unix, displayno, authproto, authdata);
        nsockets++;
    } else {
        sk_close(sockets[nsockets]);
        sfree(unix_path);
        unix_path = NULL;
    }

    /*
     * Decide where the authority data will be written.
     */

    tmpdir = getenv("TMPDIR");
    if (!tmpdir || !*tmpdir)
        tmpdir = "/tmp";

    authfilename = dupcat(tmpdir, "/", progname, "-Xauthority-XXXXXX");

    {
        int oldumask = umask(077);
        authfd = mkstemp(authfilename);
        umask(oldumask);
    }
    if (authfd < 0) {
        while (nsockets-- > 0)
            sk_close(sockets[nsockets]);
        goto out;
    }

    /*
     * Spawn a subprocess which will try to reliably delete our
     * auth file when we terminate, in case we die unexpectedly.
     */
    {
        int cleanup_pipe[2];
        pid_t pid;

        /* Don't worry if pipe or fork fails; it's not _that_ critical. */
        if (!pipe(cleanup_pipe)) {
            if ((pid = fork()) == 0) {
                int buf[1024];
                /*
                 * Our parent process holds the writing end of
                 * this pipe, and writes nothing to it. Hence,
                 * we expect read() to return EOF as soon as
                 * that process terminates.
                 */

                close(0);
                close(1);
                close(2);

                setpgid(0, 0);
                close(cleanup_pipe[1]);
                close(authfd);
                while (read(cleanup_pipe[0], buf, sizeof(buf)) > 0);
                unlink(authfilename);
                if (unix_path)
                    unlink(unix_path);
                _exit(0);
            } else if (pid < 0) {
                close(cleanup_pipe[0]);
                close(cleanup_pipe[1]);
            } else {
                close(cleanup_pipe[0]);
                cloexec(cleanup_pipe[1]);
            }
        }
    }

    authfp = fdopen(authfd, "wb");
    fwrite(authfiledata->u, 1, authfiledata->len, authfp);
    fclose(authfp);

    {
        char *display = dupprintf(":%d%s", displayno, screen_number_suffix);
        conf_set_str_str(conf, CONF_environmt, "DISPLAY", display);
        sfree(display);
    }
    conf_set_str_str(conf, CONF_environmt, "XAUTHORITY", authfilename);

    /*
     * FIXME: return at least the DISPLAY and XAUTHORITY env settings,
     * and perhaps also the display number
     */

  out:
    if (a_tcp)
        sk_addr_free(a_tcp);
    /* a_unix doesn't need freeing, because new_unix_listener took it over */
    sfree(authfilename);
    strbuf_free(authfiledata);
    sfree(unix_path);
    return nsockets;
}